

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  bool bVar1;
  byte bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  const_reference ppcVar3;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  undefined1 local_378 [8];
  cmXMLWriter xml;
  undefined1 local_318 [8];
  cmGeneratedFileStream fout;
  string filename;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string name;
  cmLocalGenerator *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  bVar1 = std::operator!=(&this->HomeDirectory,&this->HomeOutputDirectory);
  if (!bVar1) {
    __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmExtraEclipseCDT4Generator.cxx"
                  ,0xab,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
  }
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_00,0);
  name.field_2._8_8_ = *ppcVar3;
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_58,(cmLocalGenerator *)name.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Source",&local_79);
  GetPathBasename((string *)((long)&filename.field_2 + 8),&this->HomeDirectory);
  GenerateProjectName((string *)local_38,&local_58,&local_78,(string *)((long)&filename.field_2 + 8)
                     );
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x240,&this->HomeDirectory,"/.project");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_318,(string *)&fout.field_0x240,false,None);
  bVar2 = std::ios::operator!((ios *)(local_318 + (long)*(_func_int **)((long)local_318 + -0x18)));
  if ((bVar2 & 1) == 0) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_378,(ostream *)local_318,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_378,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"projectDescription",&local_399);
    cmXMLWriter::StartElement((cmXMLWriter *)local_378,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"name",&local_3c1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_378,&local_3c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"comment",&local_3e9);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_378,&local_3e8,(char (*) [1])0x83d6c0);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"projects",&local_411);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_378,&local_410,(char (*) [1])0x83d6c0);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"buildSpec",&local_439);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_378,&local_438,(char (*) [1])0x83d6c0);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"natures",&local_461);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_378,&local_460,(char (*) [1])0x83d6c0);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"linkedResources",&local_489);
    cmXMLWriter::StartElement((cmXMLWriter *)local_378,&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmXMLWriter *)local_378,&this->HomeDirectory);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->SrcLinkedResources);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_378);
    cmXMLWriter::EndElement((cmXMLWriter *)local_378);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_378);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_378);
    xml._84_4_ = 0;
  }
  else {
    xml._84_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_318);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name = cmExtraEclipseCDT4Generator::GenerateProjectName(
    lg->GetProjectName(), "Source",
    cmExtraEclipseCDT4Generator::GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  cmXMLWriter xml(fout);
  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");
  xml.Element("name", name);
  xml.Element("comment", "");
  xml.Element("projects", "");
  xml.Element("buildSpec", "");
  xml.Element("natures", "");
  xml.StartElement("linkedResources");

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeDirectory);
    this->SrcLinkedResources.clear();
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
  xml.EndDocument();
}